

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

int __thiscall icu_63::Hashtable::init(Hashtable *this,EVP_PKEY_CTX *ctx)

{
  UBool UVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  UObjectDeleter *pUVar3;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  UErrorCode *in_R8;
  UErrorCode *status_local;
  undefined1 *valueComp_local;
  undefined1 *keyComp_local;
  UHashFunction *keyHash_local;
  Hashtable *this_local;
  int iVar2;
  
  UVar1 = ::U_FAILURE(*in_R8);
  iVar2 = (int)CONCAT71(extraout_var,UVar1);
  if (UVar1 == '\0') {
    uhash_init_63(&this->hashObj,(UHashFunction *)ctx,in_RDX,in_RCX,in_R8);
    UVar1 = ::U_SUCCESS(*in_R8);
    iVar2 = (int)CONCAT71(extraout_var_00,UVar1);
    if (UVar1 != '\0') {
      this->hash = &this->hashObj;
      pUVar3 = uhash_setKeyDeleter_63(this->hash,uprv_deleteUObject_63);
      iVar2 = (int)pUVar3;
    }
  }
  return iVar2;
}

Assistant:

inline void Hashtable::init(UHashFunction *keyHash, UKeyComparator *keyComp,
                            UValueComparator *valueComp, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    uhash_init(&hashObj, keyHash, keyComp, valueComp, &status);
    if (U_SUCCESS(status)) {
        hash = &hashObj;
        uhash_setKeyDeleter(hash, uprv_deleteUObject);
    }
}